

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap_blitter_p.h
# Opt level: O0

void __thiscall
QBlittablePlatformPixmap::markRasterOverlay
          (QBlittablePlatformPixmap *this,QPointF *points,int pointCount)

{
  int pointCount_local;
  QPointF *points_local;
  QBlittablePlatformPixmap *this_local;
  
  return;
}

Assistant:

inline void QBlittablePlatformPixmap::markRasterOverlay(const QPointF *points, int pointCount)
{
#ifdef QT_BLITTER_RASTEROVERLAY
#error "not ported yet"
#else
    Q_UNUSED(points);
    Q_UNUSED(pointCount);
#endif
}